

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::reportModifyIfContainer(CheckerVisitor *this,Expr *e,Expr *mod)

{
  uint uVar1;
  bool bVar2;
  Node *pNVar3;
  pointer pSVar4;
  pointer pSVar5;
  pointer pSVar6;
  Node *pNVar7;
  
  pSVar5 = (this->nodeStack).
           super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar3 = (Node *)0x0;
  do {
    pSVar4 = (this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar6 = pSVar5;
      pSVar5 = pSVar6 + -1;
      pNVar7 = pNVar3;
      if (pSVar6 == pSVar4) goto LAB_0014405e;
    } while ((pSVar5->sst != SST_NODE) || (pNVar7 = pSVar6[-1].field_1.n, pNVar7->_op != TO_FOREACH)
            );
    bVar2 = NodeEqualChecker::check
                      ((NodeEqualChecker *)&this->field_0x20,*(Node **)&pNVar7[1]._op,&e->super_Node
                      );
    pNVar3 = pNVar7;
  } while (!bVar2);
LAB_0014405e:
  if (pSVar6 != pSVar4) {
    pSVar5 = (this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      do {
        pSVar4 = pSVar5;
        if (pSVar4 == (this->nodeStack).
                      super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
LAB_001440ba:
          report(this,&mod->super_Node,0x80);
          return;
        }
        pSVar5 = pSVar4 + -1;
      } while (pSVar4[-1].sst != SST_NODE);
      pNVar3 = pSVar4[-1].field_1.n;
      if (pNVar3 == pNVar7) goto LAB_001440ba;
    } while (((pNVar3->_op != TO_BLOCK) ||
             (uVar1 = *(uint *)(*(long *)(*(long *)&pNVar3[1]._coordinates +
                                         (ulong)(pNVar3[1]._coordinates.lineEnd - 1) * 8) + 0x18),
             0xb < uVar1)) || ((0xa80U >> (uVar1 & 0x1f) & 1) == 0));
  }
  return;
}

Assistant:

void CheckerVisitor::reportModifyIfContainer(const Expr *e, const Expr *mod) {
  bool found = false;
  const ForeachStatement *f = nullptr;
  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    const Node *n = it->n;
    if (n->op() == TO_FOREACH) {
      f = static_cast<const ForeachStatement *>(n);

      if (_equalChecker.check(f->container(), e)) {
        found = true;
        break;
      }
    }
  }

  if (!found)
    return;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    if (it->n == f)
      break;

    const Node *n = it->n;

    if (n->op() == TO_BLOCK) {
      const auto &stmts = static_cast<const Block *>(n)->statements();
      assert(stmts.size() > 0);
      const Statement *stmt = stmts.back();
      if (stmt->op() == TO_RETURN || stmt->op() == TO_THROW || stmt->op() == TO_BREAK)
        return;
    }
  }

  report(mod, DiagnosticsId::DI_MODIFIED_CONTAINER);
}